

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5MergeRowidLists(Fts5Index *p,Fts5Buffer *p1,Fts5Buffer *p2)

{
  u8 *puVar1;
  undefined8 uVar2;
  i64 iVar3;
  i64 iVar4;
  int iVar5;
  i64 iVar6;
  int iVar7;
  bool bVar8;
  int i1;
  int i2;
  i64 iRowid2;
  i64 iRowid1;
  Fts5Buffer tmp;
  uint local_80;
  uint local_7c;
  i64 local_78;
  i64 local_70;
  int local_64;
  u8 *local_60;
  Fts5Buffer local_58;
  u8 *local_48;
  int iStack_40;
  int iStack_3c;
  
  local_80 = 0;
  local_7c = 0;
  local_70 = 0;
  local_78 = 0;
  local_58.p = (u8 *)0x0;
  local_58.n = 0;
  local_58.nSpace = 0;
  sqlite3Fts5BufferSize(&p->rc,&local_58,p2->n + p1->n);
  if (p->rc == 0) {
    fts5NextRowid(p1,(int *)&local_80,&local_70);
    fts5NextRowid(p2,(int *)&local_7c,&local_78);
    local_60 = local_58.p;
    iVar6 = 0;
    iVar7 = local_58.n;
    while (iVar4 = local_70, iVar3 = local_78, -1 < (int)(local_80 & local_7c)) {
      if (((int)local_80 < 0) || (local_78 <= local_70 && -1 < (int)local_7c)) {
        bVar8 = -1 < (int)local_80;
        local_64 = iVar7;
        iVar5 = sqlite3Fts5PutVarint(local_60 + iVar7,local_78 - iVar6);
        if (iVar4 == iVar3 && bVar8) {
          fts5NextRowid(p1,(int *)&local_80,&local_70);
        }
        fts5NextRowid(p2,(int *)&local_7c,&local_78);
        iVar6 = iVar3;
        iVar7 = local_64;
      }
      else {
        iVar5 = sqlite3Fts5PutVarint(local_60 + iVar7,local_70 - iVar6);
        fts5NextRowid(p1,(int *)&local_80,&local_70);
        iVar6 = iVar4;
      }
      iVar7 = iVar7 + iVar5;
    }
    local_48 = local_58.p;
    iStack_40 = iVar7;
    iStack_3c = local_58.nSpace;
    puVar1 = p1->p;
    uVar2._0_4_ = p1->n;
    uVar2._4_4_ = p1->nSpace;
    p1->p = local_58.p;
    p1->n = iVar7;
    p1->nSpace = local_58.nSpace;
    local_58.p = puVar1;
    local_58._8_8_ = uVar2;
    sqlite3Fts5BufferFree(&local_58);
  }
  return;
}

Assistant:

static void fts5MergeRowidLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  Fts5Buffer *p2                  /* Second list to merge */
){
  int i1 = 0;
  int i2 = 0;
  i64 iRowid1 = 0;
  i64 iRowid2 = 0;
  i64 iOut = 0;

  Fts5Buffer out;
  memset(&out, 0, sizeof(out));
  sqlite3Fts5BufferSize(&p->rc, &out, p1->n + p2->n);
  if( p->rc ) return;

  fts5NextRowid(p1, &i1, &iRowid1);
  fts5NextRowid(p2, &i2, &iRowid2);
  while( i1>=0 || i2>=0 ){
    if( i1>=0 && (i2<0 || iRowid1<iRowid2) ){
      assert( iOut==0 || iRowid1>iOut );
      fts5BufferSafeAppendVarint(&out, iRowid1 - iOut);
      iOut = iRowid1;
      fts5NextRowid(p1, &i1, &iRowid1);
    }else{
      assert( iOut==0 || iRowid2>iOut );
      fts5BufferSafeAppendVarint(&out, iRowid2 - iOut);
      iOut = iRowid2;
      if( i1>=0 && iRowid1==iRowid2 ){
        fts5NextRowid(p1, &i1, &iRowid1);
      }
      fts5NextRowid(p2, &i2, &iRowid2);
    }
  }

  fts5BufferSwap(&out, p1);
  fts5BufferFree(&out);
}